

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O2

void __thiscall ArgParser::displayInfo(ArgParser *this)

{
  pointer pAVar1;
  FILE *__stream;
  _Alloc_hider _Var2;
  long lVar3;
  ulong uVar4;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  fprintf(_stderr,"%s\nAvailable options:\n",(this->m_preInfo)._M_dataplus._M_p);
  lVar3 = 0;
  for (uVar4 = 0;
      pAVar1 = (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->m_args).
                             super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pAVar1) / 0xe0);
      uVar4 = uVar4 + 1) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    if (*(uint *)((long)&pAVar1->argType + lVar3) < 5) {
      std::__cxx11::string::assign((char *)&local_b0);
    }
    __stream = _stderr;
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(((this->m_args).
                             super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
                             super__Vector_impl_data._M_start)->shortName)._M_dataplus + lVar3),
                   &local_b0);
    std::operator+(&local_90,&local_50,",");
    _Var2._M_p = local_90._M_dataplus._M_p;
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(((this->m_args).
                             super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
                             super__Vector_impl_data._M_start)->name)._M_dataplus + lVar3),&local_b0
                  );
    fprintf(__stream,"  %-15s  %-25s\t:  %s\n",_Var2._M_p,local_70._M_dataplus._M_p,
            *(undefined8 *)
             ((long)&(((this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>.
                       _M_impl.super__Vector_impl_data._M_start)->description)._M_dataplus + lVar3))
    ;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    lVar3 = lVar3 + 0xe0;
  }
  fprintf(_stderr,"%s\n",(this->m_postInfo)._M_dataplus._M_p);
  return;
}

Assistant:

void ArgParser::displayInfo()
{
    fprintf(stderr, "%s\nAvailable options:\n", m_preInfo.c_str());
    for (size_t i=0; i<m_args.size(); i++)
    {
        std::string type;
        switch (m_args[i].argType)
        {
        case ARG_UINT:
            type = " <int>";
            break;
        case ARG_FLOAT:
            type = " <float>";
            break;
        case ARG_STRING:
            type = " <string>";
            break;
        case ARG_FLAG:
        case ARG_NONE:
            type = "";
            break;
        }
        fprintf(stderr, "  %-15s  %-25s\t:  %s\n",
                (m_args[i].shortName + type + ",").c_str(),
                (m_args[i].name + type).c_str(),
                m_args[i].description.c_str());
    }
    fprintf(stderr, "%s\n", m_postInfo.c_str());
}